

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStreambuf.h
# Opt level: O1

void __thiscall
cmBasicUVStreambuf<char,_std::char_traits<char>_>::cmBasicUVStreambuf
          (cmBasicUVStreambuf<char,_std::char_traits<char>_> *this,size_t bufSize,size_t putBack)

{
  ulong uVar1;
  size_type __n;
  allocator_type local_31;
  
  *(code **)this = link;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  std::locale::locale((locale *)&this->field_0x38);
  *(undefined ***)this = &PTR__cmBasicUVStreambuf_006ac808;
  uVar1 = putBack + (putBack == 0);
  this->Stream = (uv_stream_t *)0x0;
  this->OldStreamData = (void *)0x0;
  this->PutBack = uVar1;
  if (bufSize < uVar1) {
    bufSize = uVar1;
  }
  __n = bufSize + uVar1;
  std::vector<char,_std::allocator<char>_>::vector(&this->InputBuffer,__n,&local_31);
  this->EndOfFile = false;
  close(this,(int)__n);
  return;
}

Assistant:

cmBasicUVStreambuf<CharT, Traits>::cmBasicUVStreambuf(std::size_t bufSize,
                                                      std::size_t putBack)
  : PutBack(std::max<std::size_t>(putBack, 1))
  , InputBuffer(std::max<std::size_t>(this->PutBack, bufSize) + this->PutBack)
{
  this->close();
}